

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sig.c
# Opt level: O0

int rsa_get_ctx_params(void *vprsactx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  uchar *puVar3;
  long in_RDI;
  int len;
  char *value;
  char *word;
  int i;
  size_t aid_len;
  uchar *aid;
  uchar aid_buf [128];
  OSSL_PARAM *p;
  PROV_RSA_CTX_conflict1 *prsactx;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  char *pcVar4;
  void *local_c8;
  int local_bc;
  size_t *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  PROV_RSA_CTX_conflict1 *in_stack_ffffffffffffff88;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               (char *)0x3489d6);
    if ((pOVar2 == (OSSL_PARAM *)0x0) ||
       ((puVar3 = rsa_generate_signature_aid
                            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70),
        puVar3 != (uchar *)0x0 &&
        (iVar1 = OSSL_PARAM_set_octet_string
                           ((OSSL_PARAM *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
        iVar1 != 0)))) {
      pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 (char *)0x348a54);
      if (pOVar2 != (OSSL_PARAM *)0x0) {
        in_stack_ffffffffffffff28 = pOVar2->data_type;
        if (in_stack_ffffffffffffff28 == 1) {
          iVar1 = OSSL_PARAM_set_int((OSSL_PARAM *)
                                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                     in_stack_ffffffffffffff1c);
          if (iVar1 == 0) {
            return 0;
          }
        }
        else {
          if (in_stack_ffffffffffffff28 != 4) {
            return 0;
          }
          local_c8 = (void *)0x0;
          local_bc = 0;
          while (padding_item[local_bc].id != 0) {
            if (*(uint *)(in_RDI + 0x68) == padding_item[local_bc].id) {
              local_c8 = padding_item[local_bc].ptr;
              break;
            }
            local_bc = local_bc + 1;
          }
          if (local_c8 == (void *)0x0) {
            ERR_new();
            ERR_set_debug(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                          (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
            ERR_set_error(0x39,0xc0103,(char *)0x0);
          }
          else {
            iVar1 = OSSL_PARAM_set_utf8_string
                              ((OSSL_PARAM *)CONCAT44(in_stack_ffffffffffffff2c,4),
                               (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
            if (iVar1 == 0) {
              return 0;
            }
          }
        }
      }
      pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 (char *)0x348bc4);
      if ((pOVar2 == (OSSL_PARAM *)0x0) ||
         (iVar1 = OSSL_PARAM_set_utf8_string
                            ((OSSL_PARAM *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
         iVar1 != 0)) {
        pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   (char *)0x348c19);
        if ((pOVar2 == (OSSL_PARAM *)0x0) ||
           (iVar1 = OSSL_PARAM_set_utf8_string
                              ((OSSL_PARAM *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              ), iVar1 != 0)) {
          pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                     (char *)0x348c6e);
          if (pOVar2 != (OSSL_PARAM *)0x0) {
            if (pOVar2->data_type == 1) {
              iVar1 = OSSL_PARAM_set_int((OSSL_PARAM *)
                                         CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20),
                                         in_stack_ffffffffffffff1c);
              if (iVar1 == 0) {
                return 0;
              }
            }
            else if (pOVar2->data_type == 4) {
              pcVar4 = (char *)0x0;
              iVar1 = *(int *)(in_RDI + 0xb0);
              if (iVar1 == -3) {
                pcVar4 = "max";
              }
              else if (iVar1 == -2) {
                pcVar4 = "auto";
              }
              else if (iVar1 == -1) {
                pcVar4 = "digest";
              }
              else {
                in_stack_ffffffffffffff2c =
                     BIO_snprintf((char *)pOVar2->data,pOVar2->data_size,"%d",
                                  (ulong)*(uint *)(in_RDI + 0xb0));
                if (in_stack_ffffffffffffff2c < 1) {
                  return 0;
                }
                pOVar2->return_size = (long)in_stack_ffffffffffffff2c;
              }
              if ((pcVar4 != (char *)0x0) &&
                 (iVar1 = OSSL_PARAM_set_utf8_string
                                    ((OSSL_PARAM *)
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                     (char *)CONCAT44(iVar1,in_stack_ffffffffffffff20)), iVar1 == 0)
                 ) {
                return 0;
              }
            }
          }
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int rsa_get_ctx_params(void *vprsactx, OSSL_PARAM *params)
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;
    OSSL_PARAM *p;

    if (prsactx == NULL)
        return 0;

    p = OSSL_PARAM_locate(params, OSSL_SIGNATURE_PARAM_ALGORITHM_ID);
    if (p != NULL) {
        /* The Algorithm Identifier of the combined signature algorithm */
        unsigned char aid_buf[128];
        unsigned char *aid;
        size_t  aid_len;

        aid = rsa_generate_signature_aid(prsactx, aid_buf,
                                         sizeof(aid_buf), &aid_len);
        if (aid == NULL || !OSSL_PARAM_set_octet_string(p, aid, aid_len))
            return 0;
    }

    p = OSSL_PARAM_locate(params, OSSL_SIGNATURE_PARAM_PAD_MODE);
    if (p != NULL)
        switch (p->data_type) {
        case OSSL_PARAM_INTEGER:
            if (!OSSL_PARAM_set_int(p, prsactx->pad_mode))
                return 0;
            break;
        case OSSL_PARAM_UTF8_STRING:
            {
                int i;
                const char *word = NULL;

                for (i = 0; padding_item[i].id != 0; i++) {
                    if (prsactx->pad_mode == (int)padding_item[i].id) {
                        word = padding_item[i].ptr;
                        break;
                    }
                }

                if (word != NULL) {
                    if (!OSSL_PARAM_set_utf8_string(p, word))
                        return 0;
                } else {
                    ERR_raise(ERR_LIB_PROV, ERR_R_INTERNAL_ERROR);
                }
            }
            break;
        default:
            return 0;
        }

    p = OSSL_PARAM_locate(params, OSSL_SIGNATURE_PARAM_DIGEST);
    if (p != NULL && !OSSL_PARAM_set_utf8_string(p, prsactx->mdname))
        return 0;

    p = OSSL_PARAM_locate(params, OSSL_SIGNATURE_PARAM_MGF1_DIGEST);
    if (p != NULL && !OSSL_PARAM_set_utf8_string(p, prsactx->mgf1_mdname))
        return 0;

    p = OSSL_PARAM_locate(params, OSSL_SIGNATURE_PARAM_PSS_SALTLEN);
    if (p != NULL) {
        if (p->data_type == OSSL_PARAM_INTEGER) {
            if (!OSSL_PARAM_set_int(p, prsactx->saltlen))
                return 0;
        } else if (p->data_type == OSSL_PARAM_UTF8_STRING) {
            const char *value = NULL;

            switch (prsactx->saltlen) {
            case RSA_PSS_SALTLEN_DIGEST:
                value = OSSL_PKEY_RSA_PSS_SALT_LEN_DIGEST;
                break;
            case RSA_PSS_SALTLEN_MAX:
                value = OSSL_PKEY_RSA_PSS_SALT_LEN_MAX;
                break;
            case RSA_PSS_SALTLEN_AUTO:
                value = OSSL_PKEY_RSA_PSS_SALT_LEN_AUTO;
                break;
            default:
                {
                    int len = BIO_snprintf(p->data, p->data_size, "%d",
                                           prsactx->saltlen);

                    if (len <= 0)
                        return 0;
                    p->return_size = len;
                    break;
                }
            }
            if (value != NULL
                && !OSSL_PARAM_set_utf8_string(p, value))
                return 0;
        }
    }

    return 1;
}